

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

TypedArrayBase *
Js::TypedArrayBase::ValidateTypedArray(Var aValue,ScriptContext *scriptContext,LPCWSTR apiName)

{
  bool bVar1;
  undefined8 local_38;
  TypedArrayBase *typedArrayBase;
  LPCWSTR apiName_local;
  ScriptContext *scriptContext_local;
  Var aValue_local;
  
  bVar1 = VarIs<Js::TypedArrayBase>(aValue);
  if (bVar1) {
    local_38 = UnsafeVarTo<Js::TypedArrayBase>(aValue);
  }
  else {
    local_38 = (TypedArrayBase *)0x0;
  }
  if (local_38 == (TypedArrayBase *)0x0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec25,(PCWSTR)0x0);
  }
  bVar1 = IsDetachedBuffer(local_38);
  if (!bVar1) {
    return local_38;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,apiName);
}

Assistant:

TypedArrayBase* TypedArrayBase::ValidateTypedArray(Var aValue, ScriptContext *scriptContext, LPCWSTR apiName)
    {
        TypedArrayBase *typedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(aValue);
        if (!typedArrayBase)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedTypedArray);
        }

        if (typedArrayBase->IsDetachedBuffer())
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, apiName);
        }

        return typedArrayBase;
    }